

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

int Fraig_FindFirstDiff(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int fCompl,int iWordLast,
                       int fUseRand)

{
  int local_34;
  int local_30;
  int v;
  int i;
  int fUseRand_local;
  int iWordLast_local;
  int fCompl_local;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigTable.c"
                  ,0x189,"int Fraig_FindFirstDiff(Fraig_Node_t *, Fraig_Node_t *, int, int, int)");
  }
  if (((ulong)pNode2 & 1) == 0) {
    if ((*(uint *)&pNode2->field_0x18 & 1) == (*(uint *)&pNode1->field_0x18 & 1 ^ fCompl)) {
      if (fUseRand == 0) {
        for (local_30 = 0; local_30 < iWordLast; local_30 = local_30 + 1) {
          if (pNode1->puSimD[local_30] != pNode2->puSimD[local_30]) {
            for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
              if (((pNode1->puSimD[local_30] ^ pNode2->puSimD[local_30]) &
                  1 << ((byte)local_34 & 0x1f)) != 0) {
                return local_30 * 0x20 + local_34;
              }
            }
          }
        }
      }
      else {
        for (local_30 = 0; local_30 < iWordLast; local_30 = local_30 + 1) {
          if (pNode1->puSimR[local_30] != pNode2->puSimR[local_30]) {
            for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
              if (((pNode1->puSimR[local_30] ^ pNode2->puSimR[local_30]) &
                  1 << ((byte)local_34 & 0x1f)) != 0) {
                return local_30 * 0x20 + local_34;
              }
            }
          }
        }
      }
    }
    else if (fUseRand == 0) {
      for (local_30 = 0; local_30 < iWordLast; local_30 = local_30 + 1) {
        if (pNode1->puSimD[local_30] != (pNode2->puSimD[local_30] ^ 0xffffffff)) {
          for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
            if (((pNode1->puSimD[local_30] ^ pNode2->puSimD[local_30] ^ 0xffffffff) &
                1 << ((byte)local_34 & 0x1f)) != 0) {
              return local_30 * 0x20 + local_34;
            }
          }
        }
      }
    }
    else {
      for (local_30 = 0; local_30 < iWordLast; local_30 = local_30 + 1) {
        if (pNode1->puSimR[local_30] != (pNode2->puSimR[local_30] ^ 0xffffffff)) {
          for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
            if (((pNode1->puSimR[local_30] ^ pNode2->puSimR[local_30] ^ 0xffffffff) &
                1 << ((byte)local_34 & 0x1f)) != 0) {
              return local_30 * 0x20 + local_34;
            }
          }
        }
      }
    }
    return -1;
  }
  __assert_fail("!Fraig_IsComplement(pNode2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigTable.c"
                ,0x18a,"int Fraig_FindFirstDiff(Fraig_Node_t *, Fraig_Node_t *, int, int, int)");
}

Assistant:

int Fraig_FindFirstDiff( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int fCompl, int iWordLast, int fUseRand )
{
    int i, v;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // take into account possible internal complementation
    fCompl ^= pNode1->fInv;
    fCompl ^= pNode2->fInv;
    // find the pattern
    if ( fCompl )
    {
        if ( fUseRand )
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimR[i] != ~pNode2->puSimR[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimR[i] ^ ~pNode2->puSimR[i]) & (1 << v) )
                            return i * 32 + v;
        }
        else
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimD[i] !=  ~pNode2->puSimD[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimD[i] ^ ~pNode2->puSimD[i]) & (1 << v) )
                            return i * 32 + v;
        }
    }
    else
    {
        if ( fUseRand )
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimR[i] != pNode2->puSimR[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimR[i] ^ pNode2->puSimR[i]) & (1 << v) )
                            return i * 32 + v;
        }
        else
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimD[i] !=  pNode2->puSimD[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimD[i] ^ pNode2->puSimD[i]) & (1 << v) )
                            return i * 32 + v;
        }
    }
    return -1;
}